

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

thousands_sep_result<char> *
fmt::v9::detail::thousands_sep_impl<char>
          (thousands_sep_result<char> *__return_storage_ptr__,locale_ref loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  numpunct *pnVar3;
  locale local_38;
  size_type local_30;
  size_type local_28;
  facet **ppfStack_20;
  
  if (loc.locale_ == (void *)0x0) {
    std::locale::locale(&local_38);
  }
  else {
    std::locale::locale(&local_38,(locale *)loc.locale_);
  }
  pnVar3 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_38);
  std::locale::~locale(&local_38);
  (**(code **)(*(long *)pnVar3 + 0x20))(&local_38,pnVar3);
  if (local_30 == 0) {
    cVar2 = '\0';
  }
  else {
    cVar2 = (**(code **)(*(long *)pnVar3 + 0x18))(pnVar3);
  }
  paVar1 = &(__return_storage_ptr__->grouping).field_2;
  (__return_storage_ptr__->grouping)._M_dataplus._M_p = (pointer)paVar1;
  if (local_38._M_impl == (_Impl *)&local_28) {
    paVar1->_M_allocated_capacity = local_28;
    *(facet ***)((long)&(__return_storage_ptr__->grouping).field_2 + 8) = ppfStack_20;
  }
  else {
    (__return_storage_ptr__->grouping)._M_dataplus._M_p = (pointer)local_38._M_impl;
    (__return_storage_ptr__->grouping).field_2._M_allocated_capacity = local_28;
  }
  (__return_storage_ptr__->grouping)._M_string_length = local_30;
  __return_storage_ptr__->thousands_sep = cVar2;
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC auto thousands_sep_impl(locale_ref loc) -> thousands_sep_result<Char> {
  auto& facet = std::use_facet<std::numpunct<Char>>(loc.get<std::locale>());
  auto grouping = facet.grouping();
  auto thousands_sep = grouping.empty() ? Char() : facet.thousands_sep();
  return {std::move(grouping), thousands_sep};
}